

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_timer.cpp
# Opt level: O3

timer_ticks __thiscall crnlib::timer::get_elapsed_us(timer *this)

{
  timer_ticks tVar1;
  timeval cur_time;
  timeval local_20;
  
  if ((this->field_0x10 & 1) != 0) {
    if ((this->field_0x10 & 2) == 0) {
      gettimeofday(&local_20,(__timezone_ptr_t)0x0);
      tVar1 = local_20.tv_sec * 1000000 + local_20.tv_usec;
    }
    else {
      tVar1 = this->m_stop_time;
    }
    return ((g_freq >> 1) + (tVar1 - this->m_start_time) * 1000000) / g_freq;
  }
  return 0;
}

Assistant:

timer_ticks timer::get_elapsed_us() const
    {
        CRNLIB_ASSERT(m_started);
        if (!m_started)
        {
            return 0;
        }

        timer_ticks stop_time = m_stop_time;
        if (!m_stopped)
        {
            query_counter(&stop_time);
        }

        timer_ticks delta = stop_time - m_start_time;
        return (delta * 1000000ULL + (g_freq >> 1U)) / g_freq;
    }